

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O3

int __thiscall
ft::list<int,_ft::allocator<int>_>::remove(list<int,_ft::allocator<int>_> *this,char *__filename)

{
  listNode<int> *plVar1;
  listNode<int> *plVar2;
  listNode<int> *plVar3;
  
  plVar2 = this->m_tail;
  plVar3 = this->m_head->next;
  if (plVar3 != plVar2) {
    do {
      plVar1 = plVar3->next;
      if (plVar3->data == *(int *)__filename) {
        plVar2 = plVar3->prev;
        plVar2->next = plVar1;
        plVar1->prev = plVar2;
        operator_delete(plVar3);
        this->m_size = this->m_size - 1;
        plVar2 = this->m_tail;
      }
      plVar3 = plVar1;
    } while (plVar1 != plVar2);
  }
  return (int)plVar2;
}

Assistant:

void remove(value_type const & val) {
		iterator	it = this->begin();
		while (it != this->end()) {
			if (*it == val)
				it = this->erase(it);
			else
				++it;
		}
	}